

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O3

void htmlDocDumpMemoryFormat(xmlDocPtr cur,xmlChar **mem,int *size,int format)

{
  xmlCharEncoding xVar1;
  xmlChar *pxVar2;
  xmlCharEncodingHandlerPtr encoder;
  xmlOutputBufferPtr buf;
  size_t sVar3;
  undefined4 in_register_0000000c;
  undefined8 uVar4;
  char *encoding;
  xmlBufPtr buf_00;
  xmlBufPtr *ppxVar5;
  
  uVar4 = CONCAT44(in_register_0000000c,format);
  xmlInitParser();
  encoding = (char *)CONCAT71((int7)((ulong)uVar4 >> 8),size == (int *)0x0 || mem == (xmlChar **)0x0
                             );
  if (size != (int *)0x0 && mem != (xmlChar **)0x0) {
    if (cur != (xmlDocPtr)0x0) {
      pxVar2 = htmlGetMetaEncoding(cur);
      if (pxVar2 == (xmlChar *)0x0) {
        encoder = xmlFindCharEncodingHandler("HTML");
        if (encoder == (xmlCharEncodingHandlerPtr)0x0) {
          encoder = xmlFindCharEncodingHandler("ascii");
        }
      }
      else {
        xVar1 = xmlParseCharEncoding((char *)pxVar2);
        if (xVar1 == XML_CHAR_ENCODING_UTF8) {
          encoder = (xmlCharEncodingHandlerPtr)0x0;
        }
        else {
          encoder = xmlFindCharEncodingHandler((char *)pxVar2);
          if (encoder == (xmlCharEncodingHandlerPtr)0x0) {
            encoding = "unknown encoding %s\n";
            encoder = (xmlCharEncodingHandlerPtr)0x0;
            __xmlSimpleError(7,0x57b,(xmlNodePtr)0x0,"unknown encoding %s\n",(char *)pxVar2);
          }
        }
      }
      buf = xmlAllocOutputBufferInternal(encoder);
      if (buf != (xmlOutputBufferPtr)0x0) {
        htmlNodeDumpFormatOutput(buf,cur,(xmlNodePtr)cur,encoding,format);
        xmlOutputBufferFlush(buf);
        buf_00 = buf->conv;
        if (buf_00 == (xmlBufPtr)0x0) {
          ppxVar5 = &buf->buffer;
          buf_00 = buf->buffer;
        }
        else {
          ppxVar5 = &buf->conv;
        }
        sVar3 = xmlBufUse(buf_00);
        *size = (int)sVar3;
        pxVar2 = xmlBufContent(*ppxVar5);
        pxVar2 = xmlStrndup(pxVar2,*size);
        *mem = pxVar2;
        xmlOutputBufferClose(buf);
        return;
      }
    }
    *mem = (xmlChar *)0x0;
    *size = 0;
  }
  return;
}

Assistant:

void
htmlDocDumpMemoryFormat(xmlDocPtr cur, xmlChar**mem, int *size, int format) {
    xmlOutputBufferPtr buf;
    xmlCharEncodingHandlerPtr handler = NULL;
    const char *encoding;

    xmlInitParser();

    if ((mem == NULL) || (size == NULL))
        return;
    if (cur == NULL) {
	*mem = NULL;
	*size = 0;
	return;
    }

    encoding = (const char *) htmlGetMetaEncoding(cur);

    if (encoding != NULL) {
	xmlCharEncoding enc;

	enc = xmlParseCharEncoding(encoding);
	if (enc != XML_CHAR_ENCODING_UTF8) {
	    handler = xmlFindCharEncodingHandler(encoding);
	    if (handler == NULL)
                htmlSaveErr(XML_SAVE_UNKNOWN_ENCODING, NULL, encoding);

	}
    } else {
        /*
         * Fallback to HTML or ASCII when the encoding is unspecified
         */
        if (handler == NULL)
            handler = xmlFindCharEncodingHandler("HTML");
        if (handler == NULL)
            handler = xmlFindCharEncodingHandler("ascii");
    }

    buf = xmlAllocOutputBufferInternal(handler);
    if (buf == NULL) {
	*mem = NULL;
	*size = 0;
	return;
    }

    htmlDocContentDumpFormatOutput(buf, cur, NULL, format);

    xmlOutputBufferFlush(buf);
    if (buf->conv != NULL) {
	*size = xmlBufUse(buf->conv);
	*mem = xmlStrndup(xmlBufContent(buf->conv), *size);
    } else {
	*size = xmlBufUse(buf->buffer);
	*mem = xmlStrndup(xmlBufContent(buf->buffer), *size);
    }
    (void)xmlOutputBufferClose(buf);
}